

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void setpause(global_State *g)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long local_40;
  l_mem estimate;
  long lStack_20;
  int pause;
  l_mem debt;
  l_mem threshold;
  global_State *g_local;
  
  iVar2 = (uint)g->gcpause << 2;
  uVar3 = g->GCestimate / 100;
  if (uVar3 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    if ((long)iVar2 <
        SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar3),0)) {
      local_40 = uVar3 * (long)iVar2;
    }
    else {
      local_40 = 0x7fffffffffffffff;
    }
    lStack_20 = (g->totalbytes + g->GCdebt) - local_40;
    if (0 < lStack_20) {
      lStack_20 = 0;
    }
    luaE_setdebt(g,lStack_20);
    return;
  }
  __assert_fail("estimate > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x483,"void setpause(global_State *)");
}

Assistant:

static void setpause (global_State *g) {
  l_mem threshold, debt;
  int pause = getgcparam(g->gcpause);
  l_mem estimate = g->GCestimate / PAUSEADJ;  /* adjust 'estimate' */
  lua_assert(estimate > 0);
  threshold = (pause < MAX_LMEM / estimate)  /* overflow? */
            ? estimate * pause  /* no overflow */
            : MAX_LMEM;  /* overflow; truncate to maximum */
  debt = gettotalbytes(g) - threshold;
  if (debt > 0) debt = 0;
  luaE_setdebt(g, debt);
}